

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O0

void __thiscall
TPZMatRed<double,_TPZFMatrix<double>_>::U1
          (TPZMatRed<double,_TPZFMatrix<double>_> *this,TPZFMatrix<double> *F)

{
  TPZMatrix<double> *this_00;
  long in_RDI;
  TPZFNMatrix<1000,_double> F1Red;
  TPZFNMatrix<1000,_double> K1Red;
  DecomposeType dt;
  TPZFMatrix<double> *B;
  TPZFMatrix<double> *in_stack_ffffffffffffc030;
  TPZFMatrix<double> *in_stack_ffffffffffffc038;
  TPZFNMatrix<1000,_double> *in_stack_ffffffffffffc040;
  TPZFMatrix<double> *in_stack_ffffffffffffc048;
  TPZMatRed<double,_TPZFMatrix<double>_> *in_stack_ffffffffffffc050;
  
  TPZFNMatrix<1000,_double>::TPZFNMatrix
            (in_stack_ffffffffffffc040,(int64_t)in_stack_ffffffffffffc038,
             (int64_t)in_stack_ffffffffffffc030);
  B = *(TPZFMatrix<double> **)(in_RDI + 0x308);
  this_00 = (TPZMatrix<double> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)(in_RDI + 0x270));
  dt = (DecomposeType)((ulong)in_RDI >> 0x20);
  TPZFNMatrix<1000,_double>::TPZFNMatrix
            (in_stack_ffffffffffffc040,(int64_t)in_stack_ffffffffffffc038,
             (int64_t)in_stack_ffffffffffffc030);
  K11Reduced(in_stack_ffffffffffffc050,in_stack_ffffffffffffc048,
             &in_stack_ffffffffffffc040->super_TPZFMatrix<double>);
  TPZFMatrix<double>::operator=(in_stack_ffffffffffffc038,in_stack_ffffffffffffc030);
  TPZMatrix<double>::SolveDirect(this_00,B,dt);
  TPZFNMatrix<1000,_double>::~TPZFNMatrix((TPZFNMatrix<1000,_double> *)0x144b535);
  TPZFNMatrix<1000,_double>::~TPZFNMatrix((TPZFNMatrix<1000,_double> *)0x144b542);
  return;
}

Assistant:

void TPZMatRed<TVar,TSideMatrix>::U1(TPZFMatrix<TVar> & F)
{
	TPZFNMatrix<1000,TVar> K1Red(fDim1,fDim1), F1Red(fDim1,fF1.Cols());
	K11Reduced(K1Red, F1Red);
	F=(F1Red);
	K1Red.SolveDirect( F ,ELU);
	
	
}